

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O1

void __thiscall
GeneralHash<1,_unsigned_int,_unsigned_char>::GeneralHash
          (GeneralHash<1,_unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint uVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  allocator_type local_21;
  
  this->hashvalue = 0;
  this->wordsize = mywordsize;
  this->n = myn;
  this->irreduciblepoly = 0;
  uVar4 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar4);
  this->lastbit = 1 << ((byte)this->wordsize & 0x1f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->precomputedshift,(long)(1 << ((byte)this->n & 0x1f)),&local_21);
  if (this->wordsize == 0x13) {
    uVar4 = 0x80027;
  }
  else {
    if (this->wordsize != 9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unsupported wordsize ",0x15);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->wordsize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," bits, try 19 or 9",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      goto LAB_0010a11e;
    }
    uVar4 = 0x22d;
  }
  this->irreduciblepoly = uVar4;
LAB_0010a11e:
  puVar2 = (this->precomputedshift).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->precomputedshift).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar6 != 0) {
    uVar8 = 0;
    do {
      iVar9 = this->n;
      uVar4 = (int)uVar8 << ((char)this->wordsize - (char)iVar9 & 0x1fU);
      if (0 < iVar9) {
        uVar1 = this->lastbit;
        do {
          uVar3 = uVar4 * 2;
          uVar7 = this->irreduciblepoly ^ uVar3;
          uVar4 = uVar3;
          if ((uVar1 & uVar3) == uVar1) {
            uVar4 = uVar7;
          }
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
        uVar4 = uVar3;
        if ((uVar1 & uVar3) == uVar1) {
          uVar4 = uVar7;
        }
      }
      puVar2[uVar8] = uVar4;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < (ulong)(lVar6 >> 2));
  }
  return;
}

Assistant:

GeneralHash(int myn, int mywordsize = 19)
      : hashvalue(0), wordsize(mywordsize), n(myn), irreduciblepoly(0),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        lastbit(static_cast<hashvaluetype>(1) << wordsize),
        precomputedshift(precomputationtype == FULLPRECOMP ? (1 << n) : 0) {
    if (wordsize == 19) {
      irreduciblepoly = 1 + (1 << 1) + (1 << 2) + (1 << 5) + (1 << 19);
    } else if (wordsize == 9) {
      irreduciblepoly = 1 + (1 << 2) + (1 << 3) + (1 << 5) + (1 << 9);
    } else {
      cerr << "unsupported wordsize " << wordsize << " bits, try 19 or 9"
           << endl;
    }
    // in case the precomp is activated at the template level
    if (precomputationtype == FULLPRECOMP) {
      for (hashvaluetype x = 0; x < precomputedshift.size(); ++x) {
        hashvaluetype leftover = x << (wordsize - n);
        fastleftshift(leftover, n);
        precomputedshift[x] = leftover;
      }
    }
  }